

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O1

ClassDecl * __thiscall SQASTReader::readClassDecl(SQASTReader *this)

{
  Arena *this_00;
  ClassDecl *table;
  Chunk *pCVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  
  this_00 = this->astArena;
  pCVar1 = Arena::findChunk(this_00,0x48);
  table = (ClassDecl *)pCVar1->_ptr;
  pCVar1->_ptr = (uint8_t *)(table + 1);
  (table->super_TableDecl).super_Decl.super_Statement.super_Node._op = TO_CLASS;
  (table->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.lineStart = -1;
  (table->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.columnStart = -1;
  (table->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.lineEnd = -1;
  (table->super_TableDecl).super_Decl.super_Statement.super_Node._coordinates.columnEnd = -1;
  (table->super_TableDecl)._members._arena = this_00;
  (table->super_TableDecl)._members._vals = (TableMember *)0x0;
  (table->super_TableDecl)._members._size = 0;
  (table->super_TableDecl)._members._allocated = 0;
  (table->super_TableDecl).super_Decl.super_Statement.super_Node.super_ArenaObj._vptr_ArenaObj =
       (_func_int **)&PTR__ArenaObj_001a4e38;
  table->_key = (Expr *)0x0;
  table->_base = (Expr *)0x0;
  readTableBody(this,(TableDecl *)table);
  pEVar2 = readNullableExpression(this);
  pEVar3 = readNullableExpression(this);
  table->_key = pEVar2;
  table->_base = pEVar3;
  return table;
}

Assistant:

ClassDecl *SQASTReader::readClassDecl() {
  ClassDecl *klass = newNode<ClassDecl>(astArena, nullptr, nullptr);

  readTableBody(klass);

  Expr *key = readNullableExpression();
  Expr *base = readNullableExpression();

  klass->setClassKey(key);
  klass->setClassBase(base);

  return klass;
}